

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaReleaseLast(ExtensionSet *this,int number)

{
  byte bVar1;
  int iVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  Rep *pRVar4;
  MessageLite *pMVar5;
  int iVar6;
  Extension *pEVar7;
  LogMessage *pLVar8;
  LogFinisher local_51;
  LogMessage local_50;
  
  pEVar7 = FindOrNull(this,number);
  if (pEVar7 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,899);
    pLVar8 = LogMessage::operator<<(&local_50,"CHECK failed: extension != nullptr: ");
    pLVar8 = LogMessage::operator<<(pLVar8,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_51,pLVar8);
    LogMessage::~LogMessage(&local_50);
  }
  if (pEVar7->is_repeated == false) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,900);
    pLVar8 = LogMessage::operator<<(&local_50,"CHECK failed: extension->is_repeated: ");
    LogFinisher::operator=(&local_51,pLVar8);
    LogMessage::~LogMessage(&local_50);
  }
  bVar1 = pEVar7->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x3f);
    pLVar8 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=(&local_51,pLVar8);
    LogMessage::~LogMessage(&local_50);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 10) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x385);
    pLVar8 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE: "
                       );
    LogFinisher::operator=(&local_51,pLVar8);
    LogMessage::~LogMessage(&local_50);
  }
  pRVar3 = (pEVar7->field_0).repeated_string_value;
  iVar6 = (pRVar3->super_RepeatedPtrFieldBase).current_size_;
  if (iVar6 < 1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    pLVar8 = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_51,pLVar8);
    LogMessage::~LogMessage(&local_50);
    iVar6 = (pRVar3->super_RepeatedPtrFieldBase).current_size_;
  }
  pRVar4 = (pRVar3->super_RepeatedPtrFieldBase).rep_;
  (pRVar3->super_RepeatedPtrFieldBase).current_size_ = iVar6 + -1;
  pMVar5 = (MessageLite *)pRVar4->elements[(long)iVar6 + -1];
  iVar2 = pRVar4->allocated_size;
  pRVar4->allocated_size = iVar2 + -1;
  if (iVar6 < iVar2) {
    pRVar4->elements[(long)iVar6 + -1] = pRVar4->elements[(long)iVar2 + -1];
  }
  return pMVar5;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}